

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *in_stack_fffffffffffffe60;
  Mat *this_00;
  Mat *in_stack_fffffffffffffe68;
  ParamDict *this_01;
  ParamDict *this_02;
  Mat local_170 [2];
  Mat local_100 [2];
  ParamDict *local_10;
  
  this_02 = (ParamDict *)&stack0xffffffffffffff80;
  local_10 = in_RSI;
  Mat::Mat((Mat *)this_02);
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  ParamDict::get(this_02,iVar1,in_RDI);
  Mat::operator=(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Mat::~Mat((Mat *)0x14c133);
  Mat::~Mat((Mat *)0x14c140);
  this_01 = local_10;
  Mat::Mat(local_100);
  ParamDict::get(this_02,iVar1,in_RDI);
  Mat::operator=((Mat *)this_01,in_stack_fffffffffffffe60);
  Mat::~Mat((Mat *)0x14c1a5);
  Mat::~Mat((Mat *)0x14c1b2);
  this_00 = local_170;
  Mat::Mat(this_00);
  ParamDict::get(this_02,iVar1,in_RDI);
  Mat::operator=((Mat *)this_01,this_00);
  Mat::~Mat((Mat *)0x14c209);
  Mat::~Mat((Mat *)0x14c213);
  fVar2 = ParamDict::get(local_10,3,0.0);
  *(float *)&in_RDI[5].elemsize = fVar2;
  fVar2 = ParamDict::get(local_10,4,0.0);
  *(float *)((long)&in_RDI[5].elemsize + 4) = fVar2;
  fVar2 = ParamDict::get(local_10,5,0.0);
  *(float *)&in_RDI[5].allocator = fVar2;
  fVar2 = ParamDict::get(local_10,6,0.0);
  *(float *)((long)&in_RDI[5].allocator + 4) = fVar2;
  iVar1 = ParamDict::get(local_10,7,1);
  in_RDI[5].dims = iVar1;
  iVar1 = ParamDict::get(local_10,8,0);
  in_RDI[5].w = iVar1;
  iVar1 = ParamDict::get(local_10,9,0);
  in_RDI[5].h = iVar1;
  iVar1 = ParamDict::get(local_10,10,0);
  in_RDI[5].c = iVar1;
  fVar2 = ParamDict::get(local_10,0xb,-233.0);
  *(float *)&in_RDI[5].cstep = fVar2;
  fVar2 = ParamDict::get(local_10,0xc,-233.0);
  *(float *)((long)&in_RDI[5].cstep + 4) = fVar2;
  fVar2 = ParamDict::get(local_10,0xd,0.0);
  *(float *)&in_RDI[6].data = fVar2;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.f);
    variances[1] = pd.get(4, 0.f);
    variances[2] = pd.get(5, 0.f);
    variances[3] = pd.get(6, 0.f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);

    return 0;
}